

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O1

void __thiscall GrpLexer::mSQUOTE(GrpLexer *this,bool _createToken)

{
  uint uVar1;
  int iVar2;
  Token *pTVar3;
  ScannerException *this_00;
  long *plVar4;
  Token *pTVar5;
  size_type *psVar6;
  RefToken _token;
  RefCount<Token> local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78.ref = (Ref *)0x0;
  uVar1 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x12])(this,1);
  if ((1 < uVar1 - 0x91) && (uVar1 != 0x27)) {
    this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"no viable alt for char: ","");
    iVar2 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x12])(this,1);
    CharScanner::charName(iVar2);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_4_ = (undefined4)plVar4[3];
      local_70.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    iVar2 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0xf])(this);
    ScannerException::ScannerException(this_00,&local_70,iVar2);
    __cxa_throw(this_00,&ScannerException::typeinfo,ANTLRException::~ANTLRException);
  }
  (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x15])(this,(ulong)uVar1);
  if (_createToken) {
    if (local_78.ref == (Ref *)0x0) {
      pTVar3 = (Token *)0x0;
    }
    else {
      pTVar3 = (local_78.ref)->ptr;
    }
    if (nullToken.ref == (Ref *)0x0) {
      pTVar5 = (Token *)0x0;
    }
    else {
      pTVar5 = (nullToken.ref)->ptr;
    }
    if (pTVar3 == pTVar5) {
      (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x13])(&local_70,this,0x6d);
      RefCount<Token>::operator=(&local_78,(RefCount<Token> *)&local_70);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_70);
      if (local_78.ref == (Ref *)0x0) {
        pTVar3 = (Token *)0x0;
      }
      else {
        pTVar3 = (local_78.ref)->ptr;
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&(this->super_CharScanner).text);
      (*pTVar3->_vptr_Token[6])(pTVar3,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  RefCount<Token>::operator=(&(this->super_CharScanner)._returnToken,&local_78);
  RefCount<Token>::~RefCount(&local_78);
  return;
}

Assistant:

void GrpLexer::mSQUOTE(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = SQUOTE;
	
	{
	switch ( LA(1)) {
	case static_cast<unsigned char>('\''):
	{
		match(static_cast<unsigned char>('\''));
		break;
	}
	case static_cast<unsigned char>('\221'):
	{
		match(static_cast<unsigned char>('\221'));
		break;
	}
	case static_cast<unsigned char>('\222'):
	{
		match(static_cast<unsigned char>('\222'));
		break;
	}
	default:
	{
		throw ScannerException(std::string("no viable alt for char: ")+charName(LA(1)),getLine());
	}
	}
	}
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}